

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O3

bool fs_set_modtime(string_view path,bool quiet)

{
  long lVar1;
  string_view path_00;
  int iVar2;
  string_view fname;
  error_code ec;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  error_code local_60;
  path local_50;
  
  local_70._M_str = path._M_str;
  local_70._M_len = path._M_len;
  local_60._M_value = 0;
  local_60._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_50,&local_70,auto_format);
  lVar1 = std::chrono::_V2::system_clock::now();
  std::filesystem::last_write_time(&local_50,lVar1 + -0x59572d4cbf520000,&local_60);
  std::filesystem::__cxx11::path::~path(&local_50);
  iVar2 = local_60._M_value;
  if ((local_60._M_value != 0) && (!quiet)) {
    path_00._M_str = local_70._M_str;
    path_00._M_len = local_70._M_len;
    fname._M_str = "fs_set_modtime";
    fname._M_len = 0xe;
    fs_print_error(path_00,fname,&local_60);
  }
  return iVar2 == 0;
}

Assistant:

bool fs_set_modtime(std::string_view path, const bool quiet)
{

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM

  std::filesystem::last_write_time(path, std::filesystem::file_time_type::clock::now(), ec);
  if(!ec) FFS_LIKELY
    return true;
  // techinically IWYU <chrono> but that can break some compilers, and it works without the include.

#elif defined(_WIN32)
// https://learn.microsoft.com/en-us/windows/win32/SysInfo/changing-a-file-time-to-the-current-time
  HANDLE h = CreateFileA(path.data(),
                         FILE_WRITE_ATTRIBUTES, FILE_SHARE_WRITE, nullptr,
                         OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, nullptr);
  if (h){
    FILETIME t;
    // https://learn.microsoft.com/en-us/windows/win32/api/sysinfoapi/nf-sysinfoapi-getsystemtimeasfiletime
    GetSystemTimeAsFileTime(&t);
    BOOL ok = SetFileTime(h, nullptr, nullptr, &t);

    if(CloseHandle(h) && ok) FFS_LIKELY
      return true;
  }
#else
  // utimensat available in macOS since 10.13
  // https://github.com/python/cpython/issues/75782
  // https://gitlab.kitware.com/cmake/cmake/-/issues/17101
  if (utimensat(AT_FDCWD, path.data(), nullptr, 0) == 0)  FFS_LIKELY
    return true;
#endif

  if (!quiet)
    fs_print_error(path, __func__, ec);

  return false;
}